

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_internal.h
# Opt level: O1

int __thiscall
ImPlotColormapData::Append(ImPlotColormapData *this,char *name,ImU32 *keys,int count,bool qual)

{
  int *piVar1;
  uint *puVar2;
  bool *__src;
  ImGuiID IVar3;
  int iVar4;
  int *piVar5;
  uint *puVar6;
  size_t sVar7;
  bool *__dest;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  
  IVar3 = ImHashStr(name,0,0);
  iVar10 = -1;
  iVar4 = ImGuiStorage::GetInt(&this->Map,IVar3,-1);
  if (iVar4 == -1) {
    iVar10 = (this->Keys).Size;
    iVar4 = (this->KeyOffsets).Size;
    iVar9 = (this->KeyOffsets).Capacity;
    if (iVar4 == iVar9) {
      iVar4 = iVar4 + 1;
      if (iVar9 == 0) {
        iVar8 = 8;
      }
      else {
        iVar8 = iVar9 / 2 + iVar9;
      }
      if (iVar4 < iVar8) {
        iVar4 = iVar8;
      }
      if (iVar9 < iVar4) {
        piVar5 = (int *)ImGui::MemAlloc((long)iVar4 << 2);
        piVar1 = (this->KeyOffsets).Data;
        if (piVar1 != (int *)0x0) {
          memcpy(piVar5,piVar1,(long)(this->KeyOffsets).Size << 2);
          ImGui::MemFree((this->KeyOffsets).Data);
        }
        (this->KeyOffsets).Data = piVar5;
        (this->KeyOffsets).Capacity = iVar4;
      }
    }
    (this->KeyOffsets).Data[(this->KeyOffsets).Size] = iVar10;
    (this->KeyOffsets).Size = (this->KeyOffsets).Size + 1;
    iVar10 = (this->KeyCounts).Size;
    iVar4 = (this->KeyCounts).Capacity;
    if (iVar10 == iVar4) {
      iVar10 = iVar10 + 1;
      if (iVar4 == 0) {
        iVar9 = 8;
      }
      else {
        iVar9 = iVar4 / 2 + iVar4;
      }
      if (iVar10 < iVar9) {
        iVar10 = iVar9;
      }
      if (iVar4 < iVar10) {
        piVar5 = (int *)ImGui::MemAlloc((long)iVar10 << 2);
        piVar1 = (this->KeyCounts).Data;
        if (piVar1 != (int *)0x0) {
          memcpy(piVar5,piVar1,(long)(this->KeyCounts).Size << 2);
          ImGui::MemFree((this->KeyCounts).Data);
        }
        (this->KeyCounts).Data = piVar5;
        (this->KeyCounts).Capacity = iVar10;
      }
    }
    (this->KeyCounts).Data[(this->KeyCounts).Size] = count;
    (this->KeyCounts).Size = (this->KeyCounts).Size + 1;
    lVar11 = (long)count + (long)(this->Keys).Size;
    iVar10 = (int)lVar11;
    if ((this->Keys).Capacity < iVar10) {
      puVar6 = (uint *)ImGui::MemAlloc(lVar11 * 4);
      puVar2 = (this->Keys).Data;
      if (puVar2 != (uint *)0x0) {
        memcpy(puVar6,puVar2,(long)(this->Keys).Size << 2);
        ImGui::MemFree((this->Keys).Data);
      }
      (this->Keys).Data = puVar6;
      (this->Keys).Capacity = iVar10;
    }
    if (0 < count) {
      uVar12 = 0;
      do {
        iVar10 = (this->Keys).Size;
        iVar4 = (this->Keys).Capacity;
        if (iVar10 == iVar4) {
          if (iVar4 == 0) {
            iVar9 = 8;
          }
          else {
            iVar9 = iVar4 / 2 + iVar4;
          }
          iVar10 = iVar10 + 1;
          if (iVar10 < iVar9) {
            iVar10 = iVar9;
          }
          if (iVar4 < iVar10) {
            puVar6 = (uint *)ImGui::MemAlloc((long)iVar10 << 2);
            puVar2 = (this->Keys).Data;
            if (puVar2 != (uint *)0x0) {
              memcpy(puVar6,puVar2,(long)(this->Keys).Size << 2);
              ImGui::MemFree((this->Keys).Data);
            }
            (this->Keys).Data = puVar6;
            (this->Keys).Capacity = iVar10;
          }
        }
        (this->Keys).Data[(this->Keys).Size] = keys[uVar12];
        (this->Keys).Size = (this->Keys).Size + 1;
        uVar12 = uVar12 + 1;
      } while ((uint)count != uVar12);
    }
    iVar10 = (this->Text).Buf.Size;
    iVar4 = (this->TextOffsets).Size;
    iVar9 = iVar10 + -1;
    if (iVar10 == 0) {
      iVar9 = 0;
    }
    iVar10 = (this->TextOffsets).Capacity;
    if (iVar4 == iVar10) {
      iVar4 = iVar4 + 1;
      if (iVar10 == 0) {
        iVar8 = 8;
      }
      else {
        iVar8 = iVar10 / 2 + iVar10;
      }
      if (iVar4 < iVar8) {
        iVar4 = iVar8;
      }
      if (iVar10 < iVar4) {
        piVar5 = (int *)ImGui::MemAlloc((long)iVar4 << 2);
        piVar1 = (this->TextOffsets).Data;
        if (piVar1 != (int *)0x0) {
          memcpy(piVar5,piVar1,(long)(this->TextOffsets).Size << 2);
          ImGui::MemFree((this->TextOffsets).Data);
        }
        (this->TextOffsets).Data = piVar5;
        (this->TextOffsets).Capacity = iVar4;
      }
    }
    (this->TextOffsets).Data[(this->TextOffsets).Size] = iVar9;
    (this->TextOffsets).Size = (this->TextOffsets).Size + 1;
    sVar7 = strlen(name);
    ImGuiTextBuffer::append(&this->Text,name,name + sVar7 + 1);
    iVar10 = (this->Quals).Size;
    iVar4 = (this->Quals).Capacity;
    if (iVar10 == iVar4) {
      iVar10 = iVar10 + 1;
      if (iVar4 == 0) {
        iVar9 = 8;
      }
      else {
        iVar9 = iVar4 / 2 + iVar4;
      }
      if (iVar10 < iVar9) {
        iVar10 = iVar9;
      }
      if (iVar4 < iVar10) {
        __dest = (bool *)ImGui::MemAlloc((long)iVar10);
        __src = (this->Quals).Data;
        if (__src != (bool *)0x0) {
          memcpy(__dest,__src,(long)(this->Quals).Size);
          ImGui::MemFree((this->Quals).Data);
        }
        (this->Quals).Data = __dest;
        (this->Quals).Capacity = iVar10;
      }
    }
    (this->Quals).Data[(this->Quals).Size] = qual;
    (this->Quals).Size = (this->Quals).Size + 1;
    IVar3 = ImHashStr(name,0,0);
    iVar10 = this->Count;
    this->Count = iVar10 + 1;
    ImGuiStorage::SetInt(&this->Map,IVar3,iVar10);
    _AppendTable(this,iVar10);
  }
  return iVar10;
}

Assistant:

int Append(const char* name, const ImU32* keys, int count, bool qual) {
        if (GetIndex(name) != -1)
            return -1;
        KeyOffsets.push_back(Keys.size());
        KeyCounts.push_back(count);
        Keys.reserve(Keys.size()+count);
        for (int i = 0; i < count; ++i)
            Keys.push_back(keys[i]);
        TextOffsets.push_back(Text.size());
        Text.append(name, name + strlen(name) + 1);
        Quals.push_back(qual);
        ImGuiID id = ImHashStr(name);
        int idx = Count++;
        Map.SetInt(id,idx);
        _AppendTable(idx);
        return idx;
    }